

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::BayesianProbitRegressor::ByteSizeLong(BayesianProbitRegressor *this)

{
  bool bVar1;
  uint uVar2;
  uint32 uVar3;
  int iVar4;
  BayesianProbitRegressor_FeatureWeight *value;
  size_t sVar5;
  long lVar6;
  string *psVar7;
  uint local_20;
  int cached_size;
  uint i;
  uint count;
  size_t total_size;
  BayesianProbitRegressor *this_local;
  
  uVar2 = features_size(this);
  _i = (size_t)uVar2;
  for (local_20 = 0; local_20 < uVar2; local_20 = local_20 + 1) {
    value = features(this,local_20);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>
                      (value);
    _i = sVar5 + _i;
  }
  regressioninputfeaturename_abi_cxx11_(this);
  lVar6 = std::__cxx11::string::size();
  if (lVar6 != 0) {
    psVar7 = regressioninputfeaturename_abi_cxx11_(this);
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar7);
    _i = sVar5 + 1 + _i;
  }
  optimisminputfeaturename_abi_cxx11_(this);
  lVar6 = std::__cxx11::string::size();
  if (lVar6 != 0) {
    psVar7 = optimisminputfeaturename_abi_cxx11_(this);
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar7);
    _i = sVar5 + 1 + _i;
  }
  samplingscaleinputfeaturename_abi_cxx11_(this);
  lVar6 = std::__cxx11::string::size();
  if (lVar6 != 0) {
    psVar7 = samplingscaleinputfeaturename_abi_cxx11_(this);
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar7);
    _i = sVar5 + 1 + _i;
  }
  samplingtruncationinputfeaturename_abi_cxx11_(this);
  lVar6 = std::__cxx11::string::size();
  if (lVar6 != 0) {
    psVar7 = samplingtruncationinputfeaturename_abi_cxx11_(this);
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar7);
    _i = sVar5 + 1 + _i;
  }
  meanoutputfeaturename_abi_cxx11_(this);
  lVar6 = std::__cxx11::string::size();
  if (lVar6 != 0) {
    psVar7 = meanoutputfeaturename_abi_cxx11_(this);
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar7);
    _i = sVar5 + 2 + _i;
  }
  varianceoutputfeaturename_abi_cxx11_(this);
  lVar6 = std::__cxx11::string::size();
  if (lVar6 != 0) {
    psVar7 = varianceoutputfeaturename_abi_cxx11_(this);
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar7);
    _i = sVar5 + 2 + _i;
  }
  pessimisticprobabilityoutputfeaturename_abi_cxx11_(this);
  lVar6 = std::__cxx11::string::size();
  if (lVar6 != 0) {
    psVar7 = pessimisticprobabilityoutputfeaturename_abi_cxx11_(this);
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar7);
    _i = sVar5 + 2 + _i;
  }
  sampledprobabilityoutputfeaturename_abi_cxx11_(this);
  lVar6 = std::__cxx11::string::size();
  if (lVar6 != 0) {
    psVar7 = sampledprobabilityoutputfeaturename_abi_cxx11_(this);
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar7);
    _i = sVar5 + 2 + _i;
  }
  bVar1 = has_bias(this);
  if (bVar1) {
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::BayesianProbitRegressor_Gaussian>
                      (this->bias_);
    _i = sVar5 + 1 + _i;
  }
  uVar3 = numberoffeatures(this);
  if (uVar3 != 0) {
    uVar3 = numberoffeatures(this);
    sVar5 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar3);
    _i = sVar5 + 1 + _i;
  }
  iVar4 = google::protobuf::internal::ToCachedSize(_i);
  this->_cached_size_ = iVar4;
  return _i;
}

Assistant:

size_t BayesianProbitRegressor::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BayesianProbitRegressor)
  size_t total_size = 0;

  // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureWeight features = 3;
  {
    unsigned int count = this->features_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->features(i));
    }
  }

  // string regressionInputFeatureName = 10;
  if (this->regressioninputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->regressioninputfeaturename());
  }

  // string optimismInputFeatureName = 11;
  if (this->optimisminputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->optimisminputfeaturename());
  }

  // string samplingScaleInputFeatureName = 12;
  if (this->samplingscaleinputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->samplingscaleinputfeaturename());
  }

  // string samplingTruncationInputFeatureName = 13;
  if (this->samplingtruncationinputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->samplingtruncationinputfeaturename());
  }

  // string meanOutputFeatureName = 20;
  if (this->meanoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->meanoutputfeaturename());
  }

  // string varianceOutputFeatureName = 21;
  if (this->varianceoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->varianceoutputfeaturename());
  }

  // string pessimisticProbabilityOutputFeatureName = 22;
  if (this->pessimisticprobabilityoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->pessimisticprobabilityoutputfeaturename());
  }

  // string sampledProbabilityOutputFeatureName = 23;
  if (this->sampledprobabilityoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->sampledprobabilityoutputfeaturename());
  }

  // .CoreML.Specification.BayesianProbitRegressor.Gaussian bias = 2;
  if (this->has_bias()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->bias_);
  }

  // uint32 numberOfFeatures = 1;
  if (this->numberoffeatures() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt32Size(
        this->numberoffeatures());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}